

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_utils.h
# Opt level: O0

type draco::ConvertSignedIntToSymbol<int>(int val)

{
  UnsignedType ret;
  int val_local;
  undefined4 local_4;
  
  if (val < 0) {
    local_4 = (val + 1) * -2 | 1;
  }
  else {
    local_4 = val << 1;
  }
  return local_4;
}

Assistant:

typename std::make_unsigned<IntTypeT>::type ConvertSignedIntToSymbol(
    IntTypeT val) {
  typedef typename std::make_unsigned<IntTypeT>::type UnsignedType;
  static_assert(std::is_integral<IntTypeT>::value, "IntTypeT is not integral.");
  // Early exit if val is positive.
  if (val >= 0) {
    return static_cast<UnsignedType>(val) << 1;
  }
  val = -(val + 1);  // Map -1 to 0, -2 to -1, etc..
  UnsignedType ret = static_cast<UnsignedType>(val);
  ret <<= 1;
  ret |= 1;
  return ret;
}